

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O1

PKCS12 * d2i_PKCS12_fp(FILE *fp,PKCS12 **p12)

{
  BIO *bp;
  PKCS12 *pPVar1;
  
  bp = BIO_new_fp(fp,0);
  if (bp == (BIO *)0x0) {
    pPVar1 = (PKCS12 *)0x0;
  }
  else {
    pPVar1 = d2i_PKCS12_bio(bp,p12);
    BIO_free(bp);
  }
  return pPVar1;
}

Assistant:

PKCS12 *d2i_PKCS12_fp(FILE *fp, PKCS12 **out_p12) {
  BIO *bio;
  PKCS12 *ret;

  bio = BIO_new_fp(fp, 0 /* don't take ownership */);
  if (!bio) {
    return NULL;
  }

  ret = d2i_PKCS12_bio(bio, out_p12);
  BIO_free(bio);
  return ret;
}